

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_signature_algorithms(st_ptls_signature_algorithms_t *sa,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  uint8_t *puVar2;
  int iVar3;
  uint16_t local_52;
  uint8_t *puStack_50;
  uint16_t id;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint8_t *puStack_20;
  int ret;
  uint8_t *end_local;
  uint8_t **src_local;
  st_ptls_signature_algorithms_t *sa_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)*src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    _block_size64 = 0;
    do {
      pbVar1 = *src;
      *src = pbVar1 + 1;
      _block_size64 = _block_size64 << 8 | (ulong)*pbVar1;
      _block_size = _block_size - 1;
    } while (_block_size != 0);
    if ((ulong)((long)end - (long)*src) < _block_size64) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puStack_50 = *src + _block_size64;
      _block_size = 0;
      puStack_20 = end;
      end_local = (uint8_t *)src;
      src_local = (uint8_t **)sa;
      do {
        iVar3 = ptls_decode16(&local_52,(uint8_t **)end_local,puStack_50);
        if (iVar3 != 0) {
          return iVar3;
        }
        if (src_local[4] < (uint8_t *)0x10) {
          puVar2 = src_local[4];
          src_local[4] = puVar2 + 1;
          *(uint16_t *)((long)src_local + (long)puVar2 * 2) = local_52;
        }
        _capacity._4_4_ = 0;
      } while (*(uint8_t **)end_local != puStack_50);
      if (*(uint8_t **)end_local == puStack_50) {
        if (*(uint8_t **)end_local == puStack_20) {
          _capacity._4_4_ = 0;
        }
        else {
          _capacity._4_4_ = 0x32;
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int decode_signature_algorithms(struct st_ptls_signature_algorithms_t *sa, const uint8_t **src, const uint8_t *end)
{
    int ret;

    ptls_decode_block(*src, end, 2, {
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, src, end)) != 0)
                goto Exit;
            if (sa->count < PTLS_ELEMENTSOF(sa->list))
                sa->list[sa->count++] = id;
        } while (*src != end);
    });

    ret = 0;
Exit:
    return ret;
}